

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O3

void __thiscall level_tools::save_scene_object(level_tools *this,xr_object *object,char *name)

{
  uint32_t uVar1;
  int iVar2;
  xr_visual_object *this_00;
  undefined8 uVar3;
  string reference;
  string local_48;
  xr_visual_object *local_28;
  
  if (this->m_rmode != 1) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    make_object_ref(this,&local_48,name);
    this_00 = (xr_visual_object *)operator_new(0x98);
    xray_re::xr_visual_object::xr_visual_object(this_00,this->m_scene);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_xr_custom_object).m_name);
    std::__cxx11::string::_M_assign((string *)&this_00->m_reference);
    local_28 = this_00;
    std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
    emplace_back<xray_re::xr_custom_object*>
              ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
               this->m_scene_visuals,(xr_custom_object **)&local_28);
    uVar3 = std::__cxx11::string::append((char *)&local_48);
    (*(object->super_xr_surface_factory)._vptr_xr_surface_factory[10])(object,"$objects$",uVar3,0);
    if (xray_re::xr_file_system::instance()::instance0 == '\0') {
      iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0);
      if (iVar2 != 0) {
        xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
        __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                     &xray_re::xr_file_system::instance::instance0,&__dso_handle);
        __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
      }
    }
    uVar1 = xray_re::xr_file_system::file_age
                      (&xray_re::xr_file_system::instance::instance0,"$objects$",
                       local_48._M_dataplus._M_p);
    *(uint32_t *)&(this_00->super_xr_custom_object).field_0x6c = uVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  __assert_fail("m_rmode != RM_MAYA",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                ,0x1e,"void level_tools::save_scene_object(const xr_object *, const char *)");
}

Assistant:

void level_tools::save_scene_object(const xr_object* object, const char* name)
{
	xr_assert(m_rmode != RM_MAYA);

	std::string reference;
	make_object_ref(reference, name);
	xr_visual_object* new_visual = new xr_visual_object(*m_scene);
	new_visual->co_name() = reference;
	new_visual->reference() = reference;
	m_scene_visuals->push_back(new_visual);
	object->save_object(PA_OBJECTS, reference.append(".object"));
	new_visual->file_version() = xr_file_system::instance().file_age(PA_OBJECTS, reference);
}